

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Flags.cc
# Opt level: O2

string * __thiscall
flow::util::Flags::getString(string *__return_storage_ptr__,Flags *this,string *flag)

{
  const_iterator cVar1;
  Error *pEVar2;
  string sStack_58;
  string local_38;
  
  cVar1 = std::
          _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::__detail::_Select1st,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
          ::find(&(this->set_)._M_h,flag);
  if (cVar1.
      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
      ._M_cur == (__node_type *)0x0) {
    pEVar2 = (Error *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string((string *)&local_38,(string *)flag);
    Error::Error(pEVar2,NotFound,&local_38);
    __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
  }
  if (*(int *)((long)cVar1.
                     super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                     ._M_cur + 0x28) == 0) {
    std::__cxx11::string::string
              ((string *)__return_storage_ptr__,
               (string *)
               ((long)cVar1.
                      super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<flow::util::Flags::FlagType,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_true>
                      ._M_cur + 0x30));
    return __return_storage_ptr__;
  }
  pEVar2 = (Error *)__cxa_allocate_exception(0x38);
  std::__cxx11::string::string((string *)&sStack_58,(string *)flag);
  Error::Error(pEVar2,TypeMismatch,&sStack_58);
  __cxa_throw(pEVar2,&Error::typeinfo,Error::~Error);
}

Assistant:

std::string Flags::getString(const std::string& flag) const {
  auto i = set_.find(flag);
  if (i == set_.end())
    throw Error{ErrorCode::NotFound, flag};

  if (i->second.first != FlagType::String)
    throw Error{ErrorCode::TypeMismatch, flag};

  return i->second.second;
}